

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O3

FormattedNumber __thiscall
icu_63::number::LocalizedNumberFormatter::formatDecimalQuantity
          (LocalizedNumberFormatter *this,DecimalQuantity *dq,UErrorCode *status)

{
  DecimalQuantity *this_00;
  UNumberCompactStyle UVar1;
  UFormattedNumberData *results;
  UNumberCompactStyle *in_RCX;
  UErrorCode *extraout_RDX;
  UErrorCode *extraout_RDX_00;
  UErrorCode *extraout_RDX_01;
  UFormattedNumberData *p;
  FormattedNumber FVar2;
  
  if ((int)*in_RCX < U_ILLEGAL_ARGUMENT_ERROR) {
    results = (UFormattedNumberData *)UMemory::operator_new((UMemory *)0x158,(size_t)dq);
    if (results == (UFormattedNumberData *)0x0) {
      *in_RCX = 7;
      UVar1 = 7;
      status = extraout_RDX;
    }
    else {
      memset(results,0,0x158);
      results->fMagic = 0x46444e00;
      this_00 = &results->quantity;
      impl::DecimalQuantity::DecimalQuantity(this_00);
      impl::NumberStringBuilder::NumberStringBuilder(&results->string);
      impl::DecimalQuantity::operator=(this_00,(DecimalQuantity *)status);
      p = results;
      formatImpl((LocalizedNumberFormatter *)dq,results,(UErrorCode *)in_RCX);
      if ((int)*in_RCX < U_ILLEGAL_ARGUMENT_ERROR) {
        UVar1 = UNUM_SHORT;
        status = extraout_RDX_00;
        goto LAB_0025b89f;
      }
      impl::NumberStringBuilder::~NumberStringBuilder(&results->string);
      impl::DecimalQuantity::~DecimalQuantity(this_00);
      UMemory::operator_delete((UMemory *)results,p);
      UVar1 = *in_RCX;
      status = extraout_RDX_01;
    }
  }
  else {
    UVar1 = UNUM_LONG;
  }
  results = (UFormattedNumberData *)0x0;
LAB_0025b89f:
  *(UFormattedNumberData **)
   &(this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros =
       results;
  (this->super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.notation.
  fUnion.compactStyle = UVar1;
  FVar2._8_8_ = status;
  FVar2.fResults = (UFormattedNumberData *)this;
  return FVar2;
}

Assistant:

FormattedNumber
LocalizedNumberFormatter::formatDecimalQuantity(const DecimalQuantity& dq, UErrorCode& status) const {
    if (U_FAILURE(status)) { return FormattedNumber(U_ILLEGAL_ARGUMENT_ERROR); }
    auto results = new UFormattedNumberData();
    if (results == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return FormattedNumber(status);
    }
    results->quantity = dq;
    formatImpl(results, status);

    // Do not save the results object if we encountered a failure.
    if (U_SUCCESS(status)) {
        return FormattedNumber(results);
    } else {
        delete results;
        return FormattedNumber(status);
    }
}